

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

sunrealtype N_VMinQuotient_Serial(N_Vector num,N_Vector denom)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar1 = *num->content;
  if (lVar1 < 1) {
    return 1.79769313486232e+308;
  }
  bVar2 = true;
  lVar5 = 0;
  dVar6 = 1.79769313486232e+308;
  do {
    dVar8 = *(double *)(*(long *)((long)denom->content + 0x10) + lVar5 * 8);
    if ((dVar8 != 0.0) || (dVar7 = dVar6, NAN(dVar8))) {
      bVar4 = false;
      dVar8 = *(double *)(*(long *)((long)num->content + 0x10) + lVar5 * 8) / dVar8;
      bVar3 = !bVar2;
      dVar7 = dVar8;
      bVar2 = bVar4;
      if ((bVar3) && (dVar7 = dVar6, dVar8 <= dVar6)) {
        dVar7 = dVar8;
      }
    }
    lVar5 = lVar5 + 1;
    dVar6 = dVar7;
  } while (lVar1 != lVar5);
  return dVar7;
}

Assistant:

sunrealtype N_VMinQuotient_Serial(N_Vector num, N_Vector denom)
{
  sunbooleantype notEvenOnce;
  sunindextype i, N;
  sunrealtype *nd, *dd, min;

  nd = dd = NULL;

  N  = NV_LENGTH_S(num);
  nd = NV_DATA_S(num);
  dd = NV_DATA_S(denom);

  notEvenOnce = SUNTRUE;
  min         = SUN_BIG_REAL;

  for (i = 0; i < N; i++)
  {
    if (dd[i] == ZERO) { continue; }
    else
    {
      if (!notEvenOnce) { min = SUNMIN(min, nd[i] / dd[i]); }
      else
      {
        min         = nd[i] / dd[i];
        notEvenOnce = SUNFALSE;
      }
    }
  }

  return (min);
}